

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoRandomDataProvider.cc
# Opt level: O2

void __thiscall
CryptoRandomDataProvider::provideRandomData(CryptoRandomDataProvider *this,uchar *data,size_t len)

{
  shared_ptr<QPDFCryptoImpl> crypto;
  long *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  QPDFCryptoProvider::getImpl();
  (**(code **)(*local_28 + 0x10))(local_28,data,len);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void
CryptoRandomDataProvider::provideRandomData(unsigned char* data, size_t len)
{
    auto crypto = QPDFCryptoProvider::getImpl();
    crypto->provideRandomData(data, len);
}